

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O2

void __thiscall spirv_cross::CompilerGLSL::reorder_type_alias(CompilerGLSL *this)

{
  uint32_t uVar1;
  bool bVar2;
  SPIRType *pSVar3;
  TypedID<(spirv_cross::Types)0> *pTVar4;
  TypedID<(spirv_cross::Types)0> *pTVar5;
  TypedID<(spirv_cross::Types)0> *pTVar6;
  TypedID<(spirv_cross::Types)0> *pTVar7;
  TypedID<(spirv_cross::Types)0> *pTVar8;
  LoopLock loop_lock;
  uint32_t local_34;
  LoopLock local_30;
  
  ParsedIR::create_loop_hard_lock(&(this->super_Compiler).ir);
  pTVar4 = (this->super_Compiler).ir.ids_for_type[1].
           super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>.ptr;
  pTVar8 = pTVar4;
  do {
    if (pTVar8 == pTVar4 + (this->super_Compiler).ir.ids_for_type[1].
                           super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>.
                           buffer_size) {
      ParsedIR::LoopLock::~LoopLock(&local_30);
      return;
    }
    pSVar3 = Compiler::get<spirv_cross::SPIRType>(&this->super_Compiler,pTVar8->id);
    uVar1 = (pSVar3->type_alias).id;
    if (uVar1 != 0) {
      bVar2 = Compiler::has_extended_decoration
                        (&this->super_Compiler,uVar1,SPIRVCrossDecorationBufferBlockRepacked);
      if (!bVar2) {
        pTVar4 = (this->super_Compiler).ir.ids_for_type[1].
                 super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>.ptr;
        local_34 = (pSVar3->type_alias).id;
        pTVar4 = ::std::
                 __find_if<spirv_cross::TypedID<(spirv_cross::Types)0>*,__gnu_cxx::__ops::_Iter_equals_val<spirv_cross::TypedID<(spirv_cross::Types)0>const>>
                           (pTVar4,pTVar4 + (this->super_Compiler).ir.ids_for_type[1].
                                            super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>
                                            .buffer_size,&local_34);
        if (pTVar4 == (this->super_Compiler).ir.ids_for_type[1].
                      super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>.ptr +
                      (this->super_Compiler).ir.ids_for_type[1].
                      super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>.buffer_size) {
          __assert_fail("master_itr != end(type_ids)",
                        "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]SPIRV-Cross/spirv_glsl.cpp"
                        ,0x49af,"void spirv_cross::CompilerGLSL::reorder_type_alias()");
        }
        if (pTVar8 < pTVar4) {
          pTVar6 = (this->super_Compiler).ir.ids_for_constant_undef_or_type.
                   super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>.ptr;
          pTVar5 = ::std::
                   __find_if<spirv_cross::TypedID<(spirv_cross::Types)0>*,__gnu_cxx::__ops::_Iter_equals_val<spirv_cross::TypedID<(spirv_cross::Types)0>const>>
                             (pTVar6,pTVar6 + (this->super_Compiler).ir.
                                              ids_for_constant_undef_or_type.
                                              super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>
                                              .buffer_size,pTVar8);
          pTVar6 = (this->super_Compiler).ir.ids_for_constant_undef_or_type.
                   super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>.ptr;
          pTVar6 = ::std::
                   __find_if<spirv_cross::TypedID<(spirv_cross::Types)0>*,__gnu_cxx::__ops::_Iter_equals_val<spirv_cross::TypedID<(spirv_cross::Types)0>const>>
                             (pTVar6,pTVar6 + (this->super_Compiler).ir.
                                              ids_for_constant_undef_or_type.
                                              super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>
                                              .buffer_size,pTVar4);
          pTVar7 = (this->super_Compiler).ir.ids_for_constant_undef_or_type.
                   super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>.ptr +
                   (this->super_Compiler).ir.ids_for_constant_undef_or_type.
                   super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>.buffer_size;
          if (pTVar5 == pTVar7) {
            __assert_fail("alt_alias_itr != end(joined_types)",
                          "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]SPIRV-Cross/spirv_glsl.cpp"
                          ,0x49b7,"void spirv_cross::CompilerGLSL::reorder_type_alias()");
          }
          if (pTVar6 == pTVar7) {
            __assert_fail("alt_master_itr != end(joined_types)",
                          "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]SPIRV-Cross/spirv_glsl.cpp"
                          ,0x49b8,"void spirv_cross::CompilerGLSL::reorder_type_alias()");
          }
          uVar1 = pTVar8->id;
          pTVar8->id = pTVar4->id;
          pTVar4->id = uVar1;
          uVar1 = pTVar5->id;
          pTVar5->id = pTVar6->id;
          pTVar6->id = uVar1;
        }
      }
    }
    pTVar8 = pTVar8 + 1;
    pTVar4 = (this->super_Compiler).ir.ids_for_type[1].
             super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>.ptr;
  } while( true );
}

Assistant:

void CompilerGLSL::reorder_type_alias()
{
	// Reorder declaration of types so that the master of the type alias is always emitted first.
	// We need this in case a type B depends on type A (A must come before in the vector), but A is an alias of a type Abuffer, which
	// means declaration of A doesn't happen (yet), and order would be B, ABuffer and not ABuffer, B. Fix this up here.
	auto loop_lock = ir.create_loop_hard_lock();

	auto &type_ids = ir.ids_for_type[TypeType];
	for (auto alias_itr = begin(type_ids); alias_itr != end(type_ids); ++alias_itr)
	{
		auto &type = get<SPIRType>(*alias_itr);
		if (type.type_alias != TypeID(0) &&
		    !has_extended_decoration(type.type_alias, SPIRVCrossDecorationBufferBlockRepacked))
		{
			// We will skip declaring this type, so make sure the type_alias type comes before.
			auto master_itr = find(begin(type_ids), end(type_ids), ID(type.type_alias));
			assert(master_itr != end(type_ids));

			if (alias_itr < master_itr)
			{
				// Must also swap the type order for the constant-type joined array.
				auto &joined_types = ir.ids_for_constant_undef_or_type;
				auto alt_alias_itr = find(begin(joined_types), end(joined_types), *alias_itr);
				auto alt_master_itr = find(begin(joined_types), end(joined_types), *master_itr);
				assert(alt_alias_itr != end(joined_types));
				assert(alt_master_itr != end(joined_types));

				swap(*alias_itr, *master_itr);
				swap(*alt_alias_itr, *alt_master_itr);
			}
		}
	}
}